

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

bool __thiscall cmCTestBZR::UpdateImpl(cmCTestBZR *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *command;
  pointer pbVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> bzr_update;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string opts;
  OutputLogger out;
  UpdateParser err;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  string local_198;
  LineParser local_178;
  UpdateParser local_138;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string((string *)&local_138,"UpdateOptions",(allocator *)&local_178);
  cmCTest::GetCTestConfiguration(&local_198,pcVar1,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  command = extraout_RDX;
  if (local_198._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::string::string((string *)&local_178,"BZRUpdateOptions",(allocator *)&local_1b0);
    cmCTest::GetCTestConfiguration((string *)&local_138,pcVar1,(string *)&local_178);
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_178);
    command = extraout_RDX_00;
  }
  cmSystemTools::ParseArguments_abi_cxx11_
            (&local_1b0,(cmSystemTools *)local_198._M_dataplus._M_p,command);
  local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_start = (char **)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_138);
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x524c1a;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_138);
  for (pbVar3 = local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    local_138.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)(pbVar3->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_138);
  }
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)(this->URL)._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_138);
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_138);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_178,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "pull-out> ");
  UpdateParser::UpdateParser(&local_138,this,"pull-err> ");
  bVar2 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,local_1c8._M_impl.super__Vector_impl_data._M_start,
                     &local_178.super_OutputParser,(OutputParser *)&local_138);
  UpdateParser::~UpdateParser(&local_138);
  cmProcessTools::LineParser::~LineParser(&local_178);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  std::__cxx11::string::~string((string *)&local_198);
  return bVar2;
}

Assistant:

bool cmCTestBZR::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if(opts.empty())
    {
    opts = this->CTest->GetCTestConfiguration("BZRUpdateOptions");
    }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts.c_str());

  // TODO: if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)

  // Use "bzr pull" to update the working tree.
  std::vector<char const*> bzr_update;
  bzr_update.push_back(this->CommandLineTool.c_str());
  bzr_update.push_back("pull");

  for(std::vector<std::string>::const_iterator ai = args.begin();
      ai != args.end(); ++ai)
    {
    bzr_update.push_back(ai->c_str());
    }

  bzr_update.push_back(this->URL.c_str());

  bzr_update.push_back(0);

  // For some reason bzr uses stderr to display the update status.
  OutputLogger out(this->Log, "pull-out> ");
  UpdateParser err(this, "pull-err> ");
  return this->RunUpdateCommand(&bzr_update[0], &out, &err);
}